

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void __thiscall
gvr::PointCloud::resizeVertexList(PointCloud *this,int vn,bool with_scanprop,bool with_scanpos)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  lVar9 = (long)(vn * 3);
  uVar8 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar8 = lVar9 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar8);
  iVar5 = this->n;
  if (vn <= this->n) {
    iVar5 = vn;
  }
  pfVar3 = this->vertex;
  for (uVar7 = (ulong)(uint)(iVar5 * 3); 0 < (int)uVar7; uVar7 = uVar7 - 1) {
    pfVar1[uVar7 - 1] = pfVar3[uVar7 - 1];
  }
  for (lVar2 = (long)(iVar5 * 3); lVar2 < lVar9; lVar2 = lVar2 + 1) {
    pfVar1[lVar2] = 0.0;
  }
  if (pfVar3 != (float *)0x0) {
    operator_delete__(pfVar3);
  }
  this->vertex = pfVar1;
  if (with_scanprop) {
    pfVar3 = (float *)operator_new__(uVar8);
    iVar5 = this->n;
    iVar6 = vn;
    if (iVar5 < vn) {
      iVar6 = iVar5;
    }
    pfVar1 = this->scanprop;
    for (uVar7 = (ulong)(uint)(iVar6 * 3); 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      pfVar3[uVar7 - 1] = pfVar1[uVar7 - 1];
    }
    if (vn <= iVar5) {
      iVar5 = vn;
    }
    iVar6 = vn - iVar6;
    pfVar4 = pfVar3 + (long)iVar5 * 3 + 2;
    while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
      pfVar4[-2] = 0.0;
      pfVar4[-1] = 0.0;
      *pfVar4 = 1.0;
      pfVar4 = pfVar4 + 3;
    }
  }
  else {
    pfVar1 = this->scanprop;
    pfVar3 = (float *)0x0;
  }
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  this->scanprop = pfVar3;
  if (with_scanpos) {
    pfVar3 = (float *)operator_new__(uVar8);
    iVar5 = this->n;
    if (vn <= this->n) {
      iVar5 = vn;
    }
    pfVar1 = this->scanpos;
    for (uVar8 = (ulong)(uint)(iVar5 * 3); 0 < (int)uVar8; uVar8 = uVar8 - 1) {
      pfVar3[uVar8 - 1] = pfVar1[uVar8 - 1];
    }
    for (lVar2 = (long)(iVar5 * 3); lVar2 < lVar9; lVar2 = lVar2 + 1) {
      pfVar3[lVar2] = 0.0;
    }
  }
  else {
    pfVar1 = this->scanpos;
    pfVar3 = (float *)0x0;
  }
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  this->scanpos = pfVar3;
  this->n = vn;
  return;
}

Assistant:

void PointCloud::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(n, vn)-1; i>=0; i--)
  {
    p[i]=vertex[i];
  }

  for (int i=3*std::min(n, vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] vertex;

  vertex=p;
  p=0;

  if (with_scanprop)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanprop[i];
    }

    for (int i=std::min(n, vn); i<vn; i++)
    {
      p[3*i]=0;
      p[3*i+1]=0;
      p[3*i+2]=1;
    }
  }

  delete [] scanprop;

  scanprop=p;
  p=0;

  if (with_scanpos)
  {
    p=new float [3*vn];

    for (int i=3*std::min(n, vn)-1; i>=0; i--)
    {
      p[i]=scanpos[i];
    }

    for (int i=3*std::min(n, vn); i<3*vn; i++)
    {
      p[i]=0;
    }
  }

  delete [] scanpos;

  scanpos=p;

  n=vn;
}